

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O2

void __thiscall
Rml::PropertyDefinition::PropertyDefinition
          (PropertyDefinition *this,PropertyId id,String *_default_value,bool _inherited,
          bool _forces_layout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->id = id;
  ::std::__cxx11::string::string((string *)&local_40,(string *)_default_value);
  Property::Property<std::__cxx11::string>(&this->default_value,&local_40,UNKNOWN,-1);
  ::std::__cxx11::string::~string((string *)&local_40);
  *(undefined8 *)
   ((long)&(this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->parsers).
  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsers).
  super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->inherited = _inherited;
  this->forces_layout = _forces_layout;
  (this->default_value).definition = this;
  return;
}

Assistant:

PropertyDefinition::PropertyDefinition(PropertyId id, const String& _default_value, bool _inherited, bool _forces_layout) :
	id(id), default_value(_default_value, Unit::UNKNOWN), relative_target(RelativeTarget::None)
{
	inherited = _inherited;
	forces_layout = _forces_layout;
	default_value.definition = this;
}